

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void ultradiffusion_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  long in_RSI;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  
  switch(*(undefined2 *)(in_RSI + 0x20)) {
  case 1:
  case 2:
  case 3:
    send_to_char(unaff_retaddr,in_RDI);
    break;
  case 4:
  case 6:
  case 8:
    send_to_char(unaff_retaddr,in_RDI);
    break;
  default:
    break;
  case 10:
  case 0xc:
  case 0xe:
    send_to_char(unaff_retaddr,in_RDI);
    break;
  case 0x10:
  case 0x12:
  case 0x14:
    send_to_char(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void ultradiffusion_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	switch (af->duration)
	{
		case 20:
		case 18:
		case 16:
			send_to_char("You note the odd sensation of a few of your component particles drifting away.\n\r", ch);
			break;
		case 14:
		case 12:
		case 10:
			send_to_char("You are starting to lose control of your molecular cohesion.\n\r", ch);
			break;
		case 8:
		case 6:
		case 4:
			send_to_char("You sense that you are coming dangerously close to losing cohesion entirely.\n\r", ch);
			break;
		case 3:
		case 2:
		case 1:
			send_to_char("Your consciousness begins to fade as you lose cohesion.\n\rIt may already be too late.\n\r", ch);
			break;
		default:
			break;
	}
}